

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

NodeData * __thiscall c4::yml::Parser::_append_val(Parser *this,csubstr val,flag_t quoted)

{
  undefined1 uVar1;
  Tree *pTVar2;
  size_t node;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  bool bVar8;
  NodeData *pNVar9;
  State *pSVar10;
  size_t ichild;
  ulong uVar11;
  size_t iprev_sibling;
  csubstr cVar12;
  char msg [32];
  char local_f8 [24];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  undefined1 local_c8;
  char *local_b8;
  size_t local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_b0 = val.len;
  local_b8 = val.str;
  pSVar10 = this->m_state;
  if ((pSVar10->flags & 0x200) != 0) {
    builtin_strncpy(local_f8 + 0x10," has_all",8);
    uStack_e0 = 0x43535328;
    uStack_dc = 0x29294c;
    builtin_strncpy(local_f8,"check failed: (!",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_58 = 0;
    uStack_50 = 0x78f5;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x78f5) << 0x40);
    LVar4.name.str._0_4_ = 0x1f7f5a;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_f8,0x20,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
  }
  if (pSVar10->node_id == 0xffffffffffffffff) {
LAB_001d4ce1:
    local_d8 = 0x6e;
    uStack_d7 = 0x297274706c6c75;
    uStack_d0 = 0;
    builtin_strncpy(local_f8 + 0x10,"ode(m_st",8);
    uStack_e0 = 0x29657461;
    uStack_dc = 0x203d2120;
    builtin_strncpy(local_f8,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_80 = 0;
    uStack_78 = 0x78f6;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x78f6) << 0x40);
    LVar6.name.str._0_4_ = 0x1f7f5a;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_f8,0x29,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  else {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= pSVar10->node_id) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = 't';
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      uStack_e0 = 0x1f7f5a;
      uStack_dc = 0;
      local_d8 = 0x65;
      uStack_d7 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar2->m_buf == (NodeData *)0x0) goto LAB_001d4ce1;
  }
  pTVar2 = this->m_tree;
  uVar11 = this->m_state->node_id;
  if ((uVar11 == 0xffffffffffffffff) || (pTVar2->m_cap <= uVar11)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    uStack_e0 = 0x1f7f5a;
    uStack_dc = 0;
    local_d8 = 0x65;
    uStack_d7 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar2->m_buf[uVar11].m_type.type & SEQ) == NOTYPE) {
    local_d8 = 0x73;
    uStack_d7 = 0x6e3e2d65746174;
    uStack_d0 = 0x6f;
    uStack_cf = 0x292964695f6564;
    builtin_strncpy(local_f8 + 0x10,"_tree->i",8);
    uStack_e0 = 0x65735f73;
    uStack_dc = 0x5f6d2871;
    builtin_strncpy(local_f8,"check failed: (m",0x10);
    local_c8 = 0;
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_a8 = 0;
    uStack_a0 = 0x78f7;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x78f7) << 0x40);
    LVar7.name.str._0_4_ = 0x1f7f5a;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_f8,0x31,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  pTVar2 = this->m_tree;
  node = this->m_state->node_id;
  uVar11 = pTVar2->m_cap;
  if (node < uVar11 && node != 0xffffffffffffffff) {
    pNVar9 = pTVar2->m_buf;
    iprev_sibling = pNVar9[node].m_last_child;
  }
  else {
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7d;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    uStack_e0 = 0x1f7f5a;
    uStack_dc = 0;
    local_d8 = 0x65;
    uStack_d7 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar9 = pTVar2->m_buf;
    iprev_sibling = pNVar9[node].m_last_child;
    if (node == 0xffffffffffffffff) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x4f;
      local_f8[9] = 'L';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      uStack_e0 = 0x1f7f5a;
      uStack_dc = 0;
      local_d8 = 0x65;
      uStack_d7 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7a;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      uStack_e0 = 0x1f7f5a;
      uStack_dc = 0;
      local_d8 = 0x65;
      uStack_d7 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar1 = (undefined1)pTVar2->m_buf[-1].m_type.type;
      goto joined_r0x001d51ce;
    }
    uVar11 = pTVar2->m_cap;
  }
  if (uVar11 <= node) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    uStack_e0 = 0x1f7f5a;
    uStack_dc = 0;
    local_d8 = 0x65;
    uStack_d7 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar9 = pTVar2->m_buf;
  }
  uVar1 = (undefined1)pNVar9[node].m_type.type;
joined_r0x001d51ce:
  if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar8 = Tree::is_root(pTVar2,node), !bVar8)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      pNVar9 = (NodeData *)(*pcVar3)();
      return pNVar9;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x4e;
    local_f8[9] = 'L';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    uStack_e0 = 0x1f7f5a;
    uStack_dc = 0;
    local_d8 = 0x65;
    uStack_d7 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: is_container(parent) || is_root(parent)",0x35,
               (anonymous_namespace)::s_default_callbacks);
  }
  if (iprev_sibling != 0xffffffffffffffff) {
    if (pTVar2->m_cap <= iprev_sibling) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7d;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      uStack_e0 = 0x1f7f5a;
      uStack_dc = 0;
      local_d8 = 0x65;
      uStack_d7 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (pTVar2->m_buf[iprev_sibling].m_parent != node) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x4d;
      local_f8[9] = 'L';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      uStack_e0 = 0x1f7f5a;
      uStack_dc = 0;
      local_d8 = 0x65;
      uStack_d7 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  ichild = Tree::_claim(pTVar2);
  Tree::_set_hierarchy(pTVar2,ichild,node,iprev_sibling);
  cVar12.len = local_b0;
  cVar12.str = local_b8;
  Tree::to_val(this->m_tree,ichild,cVar12,(ulong)(quoted != 0) << 0xc);
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar2 = this->m_tree;
    cVar12 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar2,ichild,cVar12);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  _write_val_anchor(this,ichild);
  if (ichild == 0xffffffffffffffff) {
    pNVar9 = (NodeData *)0x0;
  }
  else {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= ichild) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = 't';
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      uStack_e0 = 0x1f7f5a;
      uStack_dc = 0;
      local_d8 = 0x65;
      uStack_d7 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar9 = pTVar2->m_buf + ichild;
  }
  return pNVar9;
}

Assistant:

NodeData* Parser::_append_val(csubstr val, flag_t quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_all(SSCL));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
    type_bits additional_flags = quoted ? VALQUO : NOTYPE;
    _c4dbgpf("append val: '{}' to parent id={} (level={}){}", val, m_state->node_id, m_state->level, quoted ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_val(nid, val, additional_flags);

    _c4dbgpf("append val: id={} val='{}'", nid, m_tree->get(nid)->m_val.scalar);
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append val[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_val_anchor(nid);
    return m_tree->get(nid);
}